

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O1

void anon_unknown.dwarf_8dd1c::getRandTRS(Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  int j;
  long lVar1;
  double dVar2;
  undefined8 local_58;
  float local_50;
  double local_48;
  double local_38;
  
  local_38 = (double)Imath_2_5::erand48(random->_state);
  local_48 = (double)Imath_2_5::erand48(random->_state);
  dVar2 = (double)Imath_2_5::erand48(random->_state);
  trans->x = (float)((1.0 - local_38) * -10.0 + local_38 * 10.0);
  trans->y = (float)((1.0 - local_48) * -10.0 + local_48 * 10.0);
  trans->z = (float)((1.0 - dVar2) * -10.0 + dVar2 * 10.0);
  dVar2 = (double)Imath_2_5::erand48(random->_state);
  local_38 = dVar2;
  dVar2 = (double)Imath_2_5::erand48(random->_state);
  local_48 = dVar2;
  dVar2 = (double)Imath_2_5::erand48(random->_state);
  rot->x = (float)((1.0 - local_38) * -180.0 + local_38 * 180.0) * 0.017453292;
  rot->y = (float)((1.0 - local_48) * -180.0 + local_48 * 180.0) * 0.017453292;
  rot->z = (float)((1.0 - dVar2) * -180.0 + dVar2 * 180.0) * 0.017453292;
  dVar2 = (double)Imath_2_5::erand48(random->_state);
  local_38 = dVar2;
  dVar2 = (double)Imath_2_5::erand48(random->_state);
  local_48 = dVar2;
  dVar2 = (double)Imath_2_5::erand48(random->_state);
  local_50 = (float)((1.0 - dVar2) * 1e-06 + dVar2 + dVar2);
  local_58 = CONCAT44((float)((1.0 - local_48) * 1e-06 + local_48 + local_48),
                      (float)((1.0 - local_38) * 1e-06 + local_38 + local_38));
  lVar1 = 0;
  do {
    dVar2 = (double)Imath_2_5::erand48(random->_state);
    if (0.5 <= (1.0 - dVar2) * 0.0 + dVar2) {
      *(uint *)((long)&local_58 + lVar1 * 4) = *(uint *)((long)&local_58 + lVar1 * 4) ^ 0x80000000;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  scale->x = (float)(undefined4)local_58;
  scale->y = (float)local_58._4_4_;
  scale->z = local_50;
  return;
}

Assistant:

void
getRandTRS(Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{
    // Translate 
    trans = V3f (random.nextf (-10, 10), 
                 random.nextf (-10, 10), 
                 random.nextf (-10, 10));
    // Rotate 
    rot = V3f (rad (random.nextf (-180, 180)),
               rad (random.nextf (-180, 180)),
               rad (random.nextf (-180, 180)));

    // Scale 
    V3f s(random.nextf (0.000001, 2.0),
          random.nextf (0.000001, 2.0),
          random.nextf (0.000001, 2.0));
    for (int j=0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5)
            s[j] *= -1;
    scale = s;
}